

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_vec2 nk_panel_get_padding(nk_style *style,nk_panel_type type)

{
  nk_panel_type type_local;
  nk_style *style_local;
  
  if (type != NK_PANEL_WINDOW) {
    if (type == NK_PANEL_GROUP) {
      return (style->window).group_padding;
    }
    if (type == NK_PANEL_POPUP) {
      return (style->window).popup_padding;
    }
    if (type == NK_PANEL_CONTEXTUAL) {
      return (style->window).contextual_padding;
    }
    if (type == NK_PANEL_COMBO) {
      return (style->window).combo_padding;
    }
    if (type == NK_PANEL_MENU) {
      return (style->window).menu_padding;
    }
    if (type == NK_PANEL_TOOLTIP) {
      return (style->window).menu_padding;
    }
  }
  return (style->window).padding;
}

Assistant:

NK_LIB struct nk_vec2
nk_panel_get_padding(const struct nk_style *style, enum nk_panel_type type)
{
    switch (type) {
    default:
    case NK_PANEL_WINDOW: return style->window.padding;
    case NK_PANEL_GROUP: return style->window.group_padding;
    case NK_PANEL_POPUP: return style->window.popup_padding;
    case NK_PANEL_CONTEXTUAL: return style->window.contextual_padding;
    case NK_PANEL_COMBO: return style->window.combo_padding;
    case NK_PANEL_MENU: return style->window.menu_padding;
    case NK_PANEL_TOOLTIP: return style->window.menu_padding;}
}